

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::handleSignal(int sig)

{
  long *plVar1;
  long lVar2;
  size_t sVar3;
  char *__s;
  
  lVar2 = 8;
  __s = "<unknown signal>";
  do {
    if (*(int *)(&UNK_001ae4c8 + lVar2) == sig) {
      __s = *(char **)((long)&signalDefs + lVar2);
      break;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  restorePreviousSignalHandlers();
  if (Context::currentContext == (undefined8 *)0x0) {
    Context::currentContext = (undefined8 *)operator_new(0x10);
    *Context::currentContext = 0;
    Context::currentContext[1] = 0;
  }
  plVar1 = (long *)Context::currentContext[1];
  sVar3 = strlen(__s);
  (**(code **)(*plVar1 + 0x78))(plVar1,__s,sVar3);
  raise(sig);
  return;
}

Assistant:

static void handleSignal( int sig ) {
        char const * name = "<unknown signal>";
        for (auto const& def : signalDefs) {
            if (sig == def.id) {
                name = def.name;
                break;
            }
        }
        // We need to restore previous signal handlers and let them do
        // their thing, so that the users can have the debugger break
        // when a signal is raised, and so on.
        restorePreviousSignalHandlers();
        reportFatal( name );
        raise( sig );
    }